

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkpoint_manager.cpp
# Opt level: O2

void __thiscall
duckdb::CheckpointReader::ReadTableData
          (CheckpointReader *this,CatalogTransaction transaction,Deserializer *deserializer,
          BoundCreateTableInfo *bound_info)

{
  unsigned_long uVar1;
  long lVar2;
  pointer pPVar3;
  ulong __n;
  MetaBlockPointer pointer;
  vector<duckdb::BlockPointer,_true> index_pointers;
  vector<duckdb::IndexStorageInfo,_true> index_storage_infos;
  TableDataReader data_reader;
  MetadataReader table_data_reader;
  vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_> local_68;
  _Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_> local_48;
  
  pointer = Deserializer::ReadProperty<duckdb::MetaBlockPointer>(deserializer,0x65,"table_pointer");
  uVar1 = Deserializer::ReadProperty<unsigned_long>(deserializer,0x66,"total_rows");
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::BlockPointer,true>>
            (&index_pointers,deserializer,0x67,"index_pointers",
             (vector<duckdb::BlockPointer,_true> *)&local_48);
  ::std::_Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::~_Vector_base
            (&local_48);
  local_68.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Deserializer::ReadPropertyWithExplicitDefault<duckdb::vector<duckdb::IndexStorageInfo,true>>
            (&index_storage_infos,deserializer,0x68,"index_storage_infos",
             (vector<duckdb::IndexStorageInfo,_true> *)&local_68);
  ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
            (&local_68);
  if (index_storage_infos.
      super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      index_storage_infos.
      super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      super__Vector_base<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    for (__n = 0; __n < (ulong)((long)index_pointers.
                                      super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                      .
                                      super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)index_pointers.
                                      super_vector<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                      .
                                      super__Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4); __n = __n + 1
        ) {
      table_data_reader.manager = (MetadataManager *)0x0;
      table_data_reader.type._0_1_ = EXISTING_BLOCKS;
      table_data_reader.block.handle.node.ptr = (FileBuffer *)0x1;
      table_data_reader.next_pointer = (MetadataPointer)0x0;
      table_data_reader.has_next_block = false;
      table_data_reader._65_7_ = 0;
      table_data_reader.read_pointers.ptr._0_4_ = 0x3f800000;
      table_data_reader.next_offset = 0;
      table_data_reader.capacity = 0;
      table_data_reader.index = 0;
      table_data_reader.offset = 0;
      table_data_reader.super_ReadStream._vptr_ReadStream = (_func_int **)&table_data_reader.type;
      table_data_reader.block.handle.handle.internal.
      super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&table_data_reader.offset;
      vector<duckdb::BlockPointer,_true>::get<true>(&index_pointers,__n);
      ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::push_back
                (&(bound_info->indexes).
                  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
                 (IndexStorageInfo *)&table_data_reader);
      IndexStorageInfo::~IndexStorageInfo((IndexStorageInfo *)&table_data_reader);
    }
  }
  else {
    ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::operator=
              (&(bound_info->indexes).
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>,
               &index_storage_infos.
                super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>);
  }
  lVar2 = __dynamic_cast(deserializer,&Deserializer::typeinfo,&BinaryDeserializer::typeinfo,0);
  if (lVar2 != 0) {
    lVar2 = __dynamic_cast(*(undefined8 *)(lVar2 + 0x278),&ReadStream::typeinfo,
                           &MetadataReader::typeinfo,0);
    if (lVar2 != 0) {
      MetadataReader::MetadataReader
                (&table_data_reader,*(MetadataManager **)(lVar2 + 8),pointer,
                 (optional_ptr<duckdb::vector<duckdb::MetaBlockPointer,_true>,_true>)0x0,
                 EXISTING_BLOCKS);
      TableDataReader::TableDataReader(&data_reader,&table_data_reader,bound_info);
      TableDataReader::ReadTableData(&data_reader);
      pPVar3 = unique_ptr<duckdb::PersistentTableData,_std::default_delete<duckdb::PersistentTableData>,_true>
               ::operator->(&bound_info->data);
      pPVar3->total_rows = uVar1;
      MetadataReader::~MetadataReader(&table_data_reader);
      ::std::vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>::~vector
                (&index_storage_infos.
                  super_vector<duckdb::IndexStorageInfo,_std::allocator<duckdb::IndexStorageInfo>_>)
      ;
      ::std::_Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_>::
      ~_Vector_base((_Vector_base<duckdb::BlockPointer,_std::allocator<duckdb::BlockPointer>_> *)
                    &index_pointers);
      return;
    }
    __cxa_bad_cast();
  }
  __cxa_bad_cast();
}

Assistant:

void CheckpointReader::ReadTableData(CatalogTransaction transaction, Deserializer &deserializer,
                                     BoundCreateTableInfo &bound_info) {

	// written in "SingleFileTableDataWriter::FinalizeTable"
	auto table_pointer = deserializer.ReadProperty<MetaBlockPointer>(101, "table_pointer");
	auto total_rows = deserializer.ReadProperty<idx_t>(102, "total_rows");

	// Cover reading old storage files.
	auto index_pointers = deserializer.ReadPropertyWithExplicitDefault<vector<BlockPointer>>(103, "index_pointers", {});
	// Cover reading new storage files.
	auto index_storage_infos =
	    deserializer.ReadPropertyWithExplicitDefault<vector<IndexStorageInfo>>(104, "index_storage_infos", {});

	if (!index_storage_infos.empty()) {
		bound_info.indexes = index_storage_infos;

	} else {
		// This is an old duckdb file containing index pointers and deprecated storage.
		for (idx_t i = 0; i < index_pointers.size(); i++) {
			// Deprecated storage is always true for old duckdb files.
			IndexStorageInfo index_storage_info;
			index_storage_info.root_block_ptr = index_pointers[i];
			bound_info.indexes.push_back(index_storage_info);
		}
	}

	// FIXME: icky downcast to get the underlying MetadataReader
	auto &binary_deserializer = dynamic_cast<BinaryDeserializer &>(deserializer);
	auto &reader = dynamic_cast<MetadataReader &>(binary_deserializer.GetStream());

	MetadataReader table_data_reader(reader.GetMetadataManager(), table_pointer);
	TableDataReader data_reader(table_data_reader, bound_info);
	data_reader.ReadTableData();

	bound_info.data->total_rows = total_rows;
}